

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::jacobiEigenSolver<float>
               (Matrix44<float> *A,Vec4<float> *S,Matrix44<float> *V,float tol)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  float *pfVar6;
  Matrix44<float> *in_RDX;
  Vec4<float> *in_RSI;
  Matrix44<float> *in_RDI;
  float in_XMM0_Da;
  BaseType BVar7;
  float in_stack_00000014;
  Vec4<float> *in_stack_00000018;
  Matrix44<float> *in_stack_00000020;
  int i_1;
  bool changed;
  Matrix44<float> *in_stack_00000028;
  Vec4<float> Z;
  int numIter;
  float absTol;
  int maxIter;
  int i;
  bool local_5d;
  bool local_51;
  undefined1 in_stack_ffffffffffffffb0;
  undefined1 uVar8;
  undefined1 in_stack_ffffffffffffffb1;
  undefined1 uVar9;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 uVar10;
  undefined1 in_stack_ffffffffffffffb3;
  undefined1 uVar11;
  float fVar12;
  int local_44;
  Vec4<float> local_3c;
  int local_2c;
  float local_28;
  undefined4 local_24;
  int local_20;
  float local_1c;
  Vec4<float> *local_10;
  Matrix44<float> *local_8;
  
  local_1c = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Matrix44<float>::makeIdentity(in_RDX);
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    pfVar6 = Matrix44<float>::operator[](local_8,local_20);
    fVar12 = pfVar6[local_20];
    pfVar6 = Vec4<float>::operator[](local_10,local_20);
    *pfVar6 = fVar12;
  }
  local_24 = 0x14;
  BVar7 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix44<float>>
                    ((Matrix44<float> *)
                     CONCAT44(local_1c,CONCAT13(in_stack_ffffffffffffffb3,
                                                CONCAT12(in_stack_ffffffffffffffb2,
                                                         CONCAT11(in_stack_ffffffffffffffb1,
                                                                  in_stack_ffffffffffffffb0)))));
  local_28 = local_1c * BVar7;
  if ((local_28 != 0.0) || (NAN(local_28))) {
    local_2c = 0;
    fVar12 = local_1c;
    do {
      local_2c = local_2c + 1;
      Vec4<float>::Vec4(&local_3c,0.0,0.0,0.0,0.0);
      bVar3 = (anonymous_namespace)::jacobiRotation<0,1,2,3,float>
                        (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014);
      bVar4 = (anonymous_namespace)::jacobiRotation<0,2,1,3,float>
                        (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014);
      bVar5 = true;
      if (!bVar4) {
        bVar5 = bVar3;
      }
      uVar11 = bVar5;
      bVar4 = (anonymous_namespace)::jacobiRotation<0,3,1,2,float>
                        (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014);
      bVar3 = true;
      if (!bVar4) {
        bVar3 = bVar5;
      }
      uVar10 = bVar3;
      bVar4 = (anonymous_namespace)::jacobiRotation<1,2,0,3,float>
                        (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014);
      bVar5 = true;
      if (!bVar4) {
        bVar5 = bVar3;
      }
      uVar9 = bVar5;
      bVar4 = (anonymous_namespace)::jacobiRotation<1,3,0,2,float>
                        (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014);
      bVar3 = true;
      if (!bVar4) {
        bVar3 = bVar5;
      }
      uVar8 = bVar3;
      bVar5 = (anonymous_namespace)::jacobiRotation<2,3,0,1,float>
                        (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014);
      local_51 = true;
      if (!bVar5) {
        local_51 = bVar3;
      }
      for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
        pfVar6 = Vec4<float>::operator[](&local_3c,local_44);
        fVar1 = *pfVar6;
        pfVar6 = Vec4<float>::operator[](local_10,local_44);
        fVar2 = *pfVar6;
        *pfVar6 = fVar1 + fVar2;
        pfVar6 = Matrix44<float>::operator[](local_8,local_44);
        pfVar6[local_44] = fVar1 + fVar2;
      }
      if (local_51 == false) {
        return;
      }
      BVar7 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix44<float>>
                        ((Matrix44<float> *)
                         CONCAT44(fVar12,CONCAT13(uVar11,CONCAT12(uVar10,CONCAT11(uVar9,uVar8)))));
      local_5d = local_28 < BVar7 && local_2c < 0x14;
    } while (local_5d);
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix44<T>& A, Vec4<T>& S, Matrix44<T>& V, const T tol)
{
    V.makeIdentity ();

    for (int i = 0; i < 4; ++i)
    {
        S[i] = A[i][i];
    }

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiagSymm (A); // Tolerance is in terms of the maximum
    if (absTol != 0)              // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            ++numIter;
            Vec4<T> Z (0, 0, 0, 0);
            bool    changed = jacobiRotation<0, 1, 2, 3> (A, V, Z, tol);
            changed = jacobiRotation<0, 2, 1, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<0, 3, 1, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 2, 0, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 3, 0, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<2, 3, 0, 1> (A, V, Z, tol) || changed;
            for (int i = 0; i < 4; ++i)
            {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed) break;
        } while (maxOffDiagSymm (A) > absTol && numIter < maxIter);
    }
}